

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_verify_restartable_ca_cb
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_ca_cb_t f_ca_cb,void *p_ca_cb,mbedtls_x509_crt_profile *profile,
              char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy,
              mbedtls_x509_crt_restart_ctx *rs_ctx)

{
  int iVar1;
  uint32_t local_f4;
  undefined1 local_f0 [4];
  uint32_t ee_flags;
  mbedtls_x509_crt_verify_chain ver_chain;
  mbedtls_pk_type_t pk_type;
  int ret;
  mbedtls_x509_crt_profile *profile_local;
  void *p_ca_cb_local;
  mbedtls_x509_crt_ca_cb_t f_ca_cb_local;
  mbedtls_x509_crl *ca_crl_local;
  mbedtls_x509_crt *trust_ca_local;
  mbedtls_x509_crt *crt_local;
  
  ver_chain._164_4_ = 0xffffff92;
  *flags = 0;
  local_f4 = 0;
  x509_crt_verify_chain_reset((mbedtls_x509_crt_verify_chain *)local_f0);
  if (profile == (mbedtls_x509_crt_profile *)0x0) {
    ver_chain._164_4_ = 0xffffd800;
  }
  else {
    if (cn != (char *)0x0) {
      x509_crt_verify_name(crt,cn,&local_f4);
    }
    ver_chain.len = mbedtls_pk_get_type(&crt->pk);
    iVar1 = x509_profile_check_pk_alg(profile,ver_chain.len);
    if (iVar1 != 0) {
      local_f4 = local_f4 | 0x8000;
    }
    iVar1 = x509_profile_check_key(profile,&crt->pk);
    if (iVar1 != 0) {
      local_f4 = local_f4 | 0x10000;
    }
    ver_chain._164_4_ =
         x509_crt_verify_chain
                   (crt,trust_ca,ca_crl,f_ca_cb,p_ca_cb,profile,
                    (mbedtls_x509_crt_verify_chain *)local_f0,rs_ctx);
    if (ver_chain._164_4_ == 0) {
      ver_chain.items[0].crt._0_4_ = local_f4 | (uint)ver_chain.items[0].crt;
      ver_chain._164_4_ =
           x509_crt_merge_flags_with_cb
                     (flags,(mbedtls_x509_crt_verify_chain *)local_f0,f_vrfy,p_vrfy);
    }
  }
  if (ver_chain._164_4_ == -0x2700) {
    ver_chain._164_4_ = 0xffffd000;
  }
  if (ver_chain._164_4_ == 0) {
    if (*flags == 0) {
      crt_local._4_4_ = 0;
    }
    else {
      crt_local._4_4_ = -0x2700;
    }
  }
  else {
    *flags = 0xffffffff;
    crt_local._4_4_ = ver_chain._164_4_;
  }
  return crt_local._4_4_;
}

Assistant:

static int x509_crt_verify_restartable_ca_cb(mbedtls_x509_crt *crt,
                                             mbedtls_x509_crt *trust_ca,
                                             mbedtls_x509_crl *ca_crl,
                                             mbedtls_x509_crt_ca_cb_t f_ca_cb,
                                             void *p_ca_cb,
                                             const mbedtls_x509_crt_profile *profile,
                                             const char *cn, uint32_t *flags,
                                             int (*f_vrfy)(void *,
                                                           mbedtls_x509_crt *,
                                                           int,
                                                           uint32_t *),
                                             void *p_vrfy,
                                             mbedtls_x509_crt_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_pk_type_t pk_type;
    mbedtls_x509_crt_verify_chain ver_chain;
    uint32_t ee_flags;

    *flags = 0;
    ee_flags = 0;
    x509_crt_verify_chain_reset(&ver_chain);

    if (profile == NULL) {
        ret = MBEDTLS_ERR_X509_BAD_INPUT_DATA;
        goto exit;
    }

    /* check name if requested */
    if (cn != NULL) {
        x509_crt_verify_name(crt, cn, &ee_flags);
    }

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type(&crt->pk);

    if (x509_profile_check_pk_alg(profile, pk_type) != 0) {
        ee_flags |= MBEDTLS_X509_BADCERT_BAD_PK;
    }

    if (x509_profile_check_key(profile, &crt->pk) != 0) {
        ee_flags |= MBEDTLS_X509_BADCERT_BAD_KEY;
    }

    /* Check the chain */
    ret = x509_crt_verify_chain(crt, trust_ca, ca_crl,
                                f_ca_cb, p_ca_cb, profile,
                                &ver_chain, rs_ctx);

    if (ret != 0) {
        goto exit;
    }

    /* Merge end-entity flags */
    ver_chain.items[0].flags |= ee_flags;

    /* Build final flags, calling callback on the way if any */
    ret = x509_crt_merge_flags_with_cb(flags, &ver_chain, f_vrfy, p_vrfy);

exit:

#if defined(MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK)
    mbedtls_x509_crt_free(ver_chain.trust_ca_cb_result);
    mbedtls_free(ver_chain.trust_ca_cb_result);
    ver_chain.trust_ca_cb_result = NULL;
#endif /* MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK */

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && ret != MBEDTLS_ERR_ECP_IN_PROGRESS) {
        mbedtls_x509_crt_restart_free(rs_ctx);
    }
#endif

    /* prevent misuse of the vrfy callback - VERIFY_FAILED would be ignored by
     * the SSL module for authmode optional, but non-zero return from the
     * callback means a fatal error so it shouldn't be ignored */
    if (ret == MBEDTLS_ERR_X509_CERT_VERIFY_FAILED) {
        ret = MBEDTLS_ERR_X509_FATAL_ERROR;
    }

    if (ret != 0) {
        *flags = (uint32_t) -1;
        return ret;
    }

    if (*flags != 0) {
        return MBEDTLS_ERR_X509_CERT_VERIFY_FAILED;
    }

    return 0;
}